

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.h
# Opt level: O0

void __thiscall
prometheus::detail::TimeWindowQuantiles::~TimeWindowQuantiles(TimeWindowQuantiles *this)

{
  TimeWindowQuantiles *this_local;
  
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::~vector(&this->ckms_quantiles_);
  return;
}

Assistant:

class PROMETHEUS_CPP_CORE_EXPORT TimeWindowQuantiles {
  using Clock = std::chrono::steady_clock;

 public:
  TimeWindowQuantiles(const std::vector<CKMSQuantiles::Quantile>& quantiles,
                      Clock::duration max_age_seconds, int age_buckets);

  double get(double q) const;
  void insert(double value);

 private:
  CKMSQuantiles& rotate() const;

  const std::vector<CKMSQuantiles::Quantile>& quantiles_;
  mutable std::vector<CKMSQuantiles> ckms_quantiles_;
  mutable std::size_t current_bucket_;

  mutable Clock::time_point last_rotation_;
  const Clock::duration rotation_interval_;
}